

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O3

bool __thiscall
glcts::ViewportArray::DepthRange::checkResults
          (DepthRange *this,texture *texture_0,texture *param_2,GLuint param_3)

{
  ostringstream *this_00;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  vector<float,_std::allocator<float>_> texture_data;
  GLfloat depth_data [32];
  float local_248;
  float local_244;
  float local_240;
  float local_23c;
  vector<float,_std::allocator<float>_> local_238;
  float local_218 [32];
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize(&local_238,0x20);
  Utils::texture::get(texture_0,0x1903,0x1406,
                      local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
  uVar5 = 0;
  uVar6 = 1;
  uVar7 = 2;
  uVar8 = 3;
  lVar2 = 0;
  do {
    fVar9 = (((float)(uVar5 >> 0x10 | 0x53000000) - 5.497642e+11) +
            (float)(uVar5 & 0xffff | 0x4b000000)) * 0.0625;
    fVar10 = (((float)(uVar6 >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(uVar6 & 0xffff | 0x4b000000)) * 0.0625;
    fVar11 = (((float)(uVar7 >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(uVar7 & 0xffff | 0x4b000000)) * 0.0625;
    fVar12 = (((float)(uVar8 >> 0x10 | 0x53000000) - 5.497642e+11) +
             (float)(uVar8 & 0xffff | 0x4b000000)) * 0.0625;
    local_218[lVar2 * 2 + 4] = fVar11;
    local_218[lVar2 * 2 + 5] = 1.0 - fVar11;
    local_218[lVar2 * 2 + 6] = fVar12;
    local_218[lVar2 * 2 + 7] = 1.0 - fVar12;
    local_218[lVar2 * 2] = fVar9;
    local_218[lVar2 * 2 + 1] = 1.0 - fVar9;
    local_218[lVar2 * 2 + 2] = fVar10;
    local_218[lVar2 * 2 + 3] = 1.0 - fVar10;
    lVar2 = lVar2 + 4;
    uVar5 = uVar5 + 4;
    uVar6 = uVar6 + 4;
    uVar7 = uVar7 + 4;
    uVar8 = uVar8 + 4;
  } while (lVar2 != 0x10);
  local_240 = *local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
  local_248 = local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[0x10];
  local_23c = local_218[0];
  bVar4 = false;
  local_244 = local_218[1];
  if ((local_218[0] == local_240) && (!NAN(local_218[0]) && !NAN(local_240))) {
    if ((local_218[1] == local_248) && (!NAN(local_218[1]) && !NAN(local_248))) {
      uVar1 = 0;
      while( true ) {
        uVar3 = uVar1;
        if (uVar3 == 0xf) {
          bVar4 = true;
          goto LAB_00dd18d8;
        }
        local_23c = local_218[uVar3 * 2 + 2];
        local_244 = local_218[uVar3 * 2 + 3];
        local_240 = local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar3 + 1];
        local_248 = local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar3 + 0x11];
        if ((local_23c != local_240) || (NAN(local_23c) || NAN(local_240))) break;
        if ((local_244 != local_248) || (uVar1 = uVar3 + 1, NAN(local_244) || NAN(local_248)))
        break;
      }
      bVar4 = 0xe < uVar3;
    }
  }
  local_198._0_8_ = ((this->super_DrawTestBase).super_TestCaseBase.m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Invalid values at ",0x12);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," expected [",0xb);
  std::ostream::_M_insert<double>((double)local_23c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
  std::ostream::_M_insert<double>((double)local_244);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"] got [",7);
  std::ostream::_M_insert<double>((double)local_240);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
  std::ostream::_M_insert<double>((double)local_248);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_120);
  if (local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
LAB_00dd18d8:
    operator_delete(local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool DepthRange::checkResults(Utils::texture& texture_0, Utils::texture& /* texture_1 */, GLuint /*draw_call_index */)
{
	static const GLfloat step = 1.0f / 16.0f;

	bool check_result = true;

	std::vector<GLfloat> texture_data;
	texture_data.resize(m_r32f_width * m_r32f_height);
	texture_0.get(GL_RED, GL_FLOAT, &texture_data[0]);

	GLfloat depth_data[16 * 2];

	for (GLuint i = 0; i < 16; ++i)
	{
		const GLfloat near = step * (GLfloat)i;

		depth_data[i * 2 + 0] = near;
		depth_data[i * 2 + 1] = 1.0f - near;
	}

	for (GLuint i = 0; i < 16; ++i)
	{
		const GLfloat expected_near = depth_data[i * 2 + 0];
		const GLfloat expected_far  = depth_data[i * 2 + 1];

		/* Bottom row should contain near values, top one should contain far values */
		const GLfloat near = texture_data[i];
		const GLfloat far  = texture_data[i + 16];

		if ((expected_near != near) || (expected_far != far))
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid values at " << i << " expected ["
												<< expected_near << ", " << expected_far << "] got [" << near << ", "
												<< far << "]" << tcu::TestLog::EndMessage;

			check_result = false;
			break;
		}
	}

	return check_result;
}